

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp sexp_bignum_normalize(sexp a)

{
  ulong uVar1;
  sexp_uint_t sVar2;
  long lVar3;
  
  if (((((ulong)a & 3) == 0) && (a->tag == 0xc)) && (sVar2 = sexp_bignum_hi(a), sVar2 < 2)) {
    uVar1 = (a->value).string.length;
    lVar3 = (long)(a->value).flonum_bits[0];
    if (uVar1 >> 0x3e != 0) {
      if (uVar1 != 0x4000000000000000 || (a->value).flonum_bits[0] != -1) {
        return a;
      }
      lVar3 = -1;
    }
    a = (sexp)(uVar1 * lVar3 * 2 + 1);
  }
  return a;
}

Assistant:

sexp sexp_bignum_normalize (sexp a) {
  sexp_uint_t *data;
  if ((! sexp_bignump(a)) || (sexp_bignum_hi(a)>1))
    return a;
  data = sexp_bignum_data(a);
  if ((data[0] > SEXP_MAX_FIXNUM)
      && ! ((sexp_bignum_sign(a) == -1) && (data[0] == SEXP_MAX_FIXNUM+1)))
    return a;
  return sexp_make_fixnum((sexp_sint_t)data[0] * sexp_bignum_sign(a));
}